

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapDynamicObject(SnapObject *snpObject,InflateMap *inflator)

{
  DynamicObject *pDVar1;
  ScriptContext *pSVar2;
  
  pDVar1 = ReuseObjectCheckAndReset(snpObject,inflator);
  if (pDVar1 != (DynamicObject *)0x0) {
    return &pDVar1->super_RecyclableObject;
  }
  pSVar2 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pDVar1 = Js::JavascriptLibrary::CreateObject
                     ((pSVar2->super_ScriptContextBase).javascriptLibrary,false,0);
  return &pDVar1->super_RecyclableObject;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapDynamicObject(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::DynamicObject* rcObj = ReuseObjectCheckAndReset(snpObject, inflator);
            if(rcObj != nullptr)
            {
                return rcObj;
            }
            else
            {
                Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
                return ctx->GetLibrary()->CreateObject();
            }
        }